

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidTreeNode.cpp
# Opt level: O0

SidTreeNode * __thiscall
COLLADASaxFWL::SidTreeNode::createAndAddChild(SidTreeNode *this,String *sid)

{
  SidTreeNode *this_00;
  ulong uVar1;
  String *_sid;
  SidIdentifier *in_RDI;
  SidIdentifier newIdentifier;
  SidTreeNode *newChild;
  SidTreeNode *__x;
  map<COLLADASaxFWL::SidTreeNode::SidIdentifier,_COLLADASaxFWL::SidTreeNode_*,_std::less<COLLADASaxFWL::SidTreeNode::SidIdentifier>,_std::allocator<std::pair<const_COLLADASaxFWL::SidTreeNode::SidIdentifier,_COLLADASaxFWL::SidTreeNode_*>_>_>
  *in_stack_ffffffffffffffa0;
  SidTreeNode *in_stack_ffffffffffffffb0;
  String *in_stack_ffffffffffffffb8;
  SidTreeNode *in_stack_ffffffffffffffc0;
  SidIdentifier *in_stack_ffffffffffffffd0;
  SidTreeNode *in_stack_ffffffffffffffd8;
  SidTreeNode *in_stack_ffffffffffffffe0;
  
  this_00 = (SidTreeNode *)operator_new(0x88);
  SidTreeNode(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  __x = this_00;
  std::vector<COLLADASaxFWL::SidTreeNode_*,_std::allocator<COLLADASaxFWL::SidTreeNode_*>_>::
  push_back((vector<COLLADASaxFWL::SidTreeNode_*,_std::allocator<COLLADASaxFWL::SidTreeNode_*>_> *)
            in_stack_ffffffffffffffa0,(value_type *)this_00);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    _sid = getSid_abi_cxx11_(this_00);
    SidIdentifier::SidIdentifier((SidIdentifier *)&stack0xffffffffffffffc8,_sid,0);
    std::make_pair<COLLADASaxFWL::SidTreeNode::SidIdentifier&,COLLADASaxFWL::SidTreeNode*&>
              (in_RDI,(SidTreeNode **)(in_RDI + 1));
    std::
    map<COLLADASaxFWL::SidTreeNode::SidIdentifier,COLLADASaxFWL::SidTreeNode*,std::less<COLLADASaxFWL::SidTreeNode::SidIdentifier>,std::allocator<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>>
    ::insert<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier,COLLADASaxFWL::SidTreeNode*>>
              (in_stack_ffffffffffffffa0,
               (pair<COLLADASaxFWL::SidTreeNode::SidIdentifier,_COLLADASaxFWL::SidTreeNode_*> *)__x)
    ;
    addChildToParents(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0)
    ;
  }
  return this_00;
}

Assistant:

SidTreeNode* SidTreeNode::createAndAddChild( const String& sid )
	{
		SidTreeNode* newChild = new SidTreeNode(sid, this);
		mDirectChildren.push_back(newChild);
		if ( !sid.empty() )
		{
			SidIdentifier newIdentifier(newChild->getSid(), 0);
			mChildren.insert(std::make_pair(newIdentifier, newChild));
			addChildToParents( newChild, newIdentifier );
		}
		return newChild;
	}